

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl_io.cpp
# Opt level: O0

void __thiscall OPLio::OPLwritePan(OPLio *this,uint channel,OPL2instrument *instr,int pan)

{
  OPLEmul *pOVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double local_48;
  double level;
  int which;
  int chanper;
  uchar bits;
  int pan_local;
  OPL2instrument *instr_local;
  uint channel_local;
  OPLio *this_local;
  
  if (instr != (OPL2instrument *)0x0) {
    if (pan < -0x24) {
      which._3_1_ = 0x10;
    }
    else if (pan < 0x25) {
      which._3_1_ = 0x30;
    }
    else {
      which._3_1_ = 0x20;
    }
    OPLwriteValue(this,0xc0,channel,instr->feedback | which._3_1_);
    uVar2 = 9;
    if ((this->IsOPL3 & 1U) != 0) {
      uVar2 = 0x12;
    }
    if (this->chips[(int)(channel / uVar2)] != (OPLEmul *)0x0) {
      if (pan < -0x3e) {
        local_48 = 0.0;
      }
      else {
        local_48 = (double)(pan + 0x3f) / 126.0;
      }
      pOVar1 = this->chips[(int)(channel / uVar2)];
      dVar3 = cos(local_48 * 1.5707963267948966);
      dVar4 = sin(local_48 * 1.5707963267948966);
      (*pOVar1->_vptr_OPLEmul[5])
                ((ulong)(uint)(float)dVar3,CONCAT44((int)((ulong)dVar4 >> 0x20),(float)dVar4),pOVar1
                 ,(ulong)(channel % uVar2));
    }
  }
  return;
}

Assistant:

void OPLio::OPLwritePan(uint channel, struct OPL2instrument *instr, int pan)
{
	if (instr != 0)
	{
		uchar bits;
		if (pan < -36) bits = 0x10;		// left
		else if (pan > 36) bits = 0x20;	// right
		else bits = 0x30;			// both

		OPLwriteValue(0xC0, channel, instr->feedback | bits);

		// Set real panning if we're using emulated chips.
		int chanper = IsOPL3 ? OPL3CHANNELS : OPL2CHANNELS;
		int which = channel / chanper;
		if (chips[which] != NULL)
		{
			// This is the MIDI-recommended pan formula. 0 and 1 are
			// both hard left so that 64 can be perfectly center.
			// (Note that the 'pan' passed to this function is the
			// MIDI pan position, subtracted by 64.)
			double level = (pan <= -63) ? 0 : (pan + 64 - 1) / 126.0;
			chips[which]->SetPanning(channel % chanper,
				(float)cos(HALF_PI * level), (float)sin(HALF_PI * level));
		}
	}
}